

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

bool __thiscall
HdlcSimulationDataGenerator::ContainsElement(HdlcSimulationDataGenerator *this,U32 index)

{
  pointer puVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  puVar1 = (this->mAbortFramesIndexes).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->mAbortFramesIndexes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar2 == 0) {
    return false;
  }
  uVar3 = 1;
  uVar4 = 0;
  do {
    bVar5 = puVar1[uVar4] == index;
    if (bVar5) {
      return bVar5;
    }
    uVar4 = (ulong)uVar3;
    uVar3 = uVar3 + 1;
  } while (uVar4 < (ulong)(lVar2 >> 2));
  return bVar5;
}

Assistant:

bool HdlcSimulationDataGenerator::ContainsElement( U32 index ) const
{
    for( U32 i = 0; i < mAbortFramesIndexes.size(); ++i )
    {
        if( mAbortFramesIndexes.at( i ) == index )
        {
            return true;
        }
    }
    return false;
}